

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O2

void __thiscall QCollator::QCollator(QCollator *this)

{
  QCollatorPrivate *this_00;
  EVP_PKEY_CTX *ctx;
  long in_FS_OFFSET;
  QLocale local_30;
  QLocale local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QCollatorPrivate *)operator_new(0x20);
  QLocale::QLocale(&local_30);
  QLocale::collation(&local_28);
  ctx = (EVP_PKEY_CTX *)&local_28;
  QCollatorPrivate::QCollatorPrivate(this_00,&local_28);
  QLocale::~QLocale(&local_28);
  QLocale::~QLocale(&local_30);
  this->d = this_00;
  QCollatorPrivate::init(this_00,ctx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCollator::QCollator()
    : d(new QCollatorPrivate(QLocale().collation()))
{
    d->init();
}